

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.h
# Opt level: O0

bool Js::JavascriptNumber::TryGetInt32Value<false>(double value,int32 *int32Value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  double dVar5;
  int32 i;
  int32 *int32Value_local;
  double value_local;
  
  if (int32Value == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.h"
                                ,0x46,"(int32Value)","int32Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  dVar5 = (double)(int)value;
  if (((dVar5 == value) && (!NAN(dVar5) && !NAN(value))) && (BVar3 = IsNegZero(value), BVar3 == 0))
  {
    *int32Value = (int)value;
    return true;
  }
  return false;
}

Assistant:

static bool TryGetInt32Value(const double value, int32 *const int32Value)
        {
            Assert(int32Value);

            const int32 i = static_cast<int32>(value);
            if (static_cast<double>(i) != value || (!acceptNegZero && IsNegZero(value)))
            {
                return false;
            }

            *int32Value = i;
            return true;
        }